

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O3

void persist_backup(void)

{
  int *piVar1;
  gbamem_t *pgVar2;
  _Bool *p_Var3;
  FILE *__s;
  
  pgVar2 = mem;
  if (mem->backup_dirty == true) {
    mem->backup_persist_countdown = 10;
    p_Var3 = &pgVar2->backup_dirty;
  }
  else {
    piVar1 = &mem->backup_persist_countdown;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      return;
    }
    if (bus->backup_type == UNKNOWN) {
      return;
    }
    if (pgVar2->backup == (uint8_t *)0x0) {
      return;
    }
    __s = fopen(pgVar2->backup_path,"wb");
    if (__s != (FILE *)0x0) {
      fwrite(mem->backup,mem->backup_size,1,__s);
      fclose(__s);
    }
    p_Var3 = &mem->backup_dirty;
  }
  *p_Var3 = false;
  return;
}

Assistant:

void persist_backup() {
    if (mem->backup_dirty) {
        mem->backup_persist_countdown = BACKUP_PERSIST_DEBOUNCE_FRAMES;
        mem->backup_dirty = 0;
    } else if (--mem->backup_persist_countdown == 0) {
        if (bus->backup_type != UNKNOWN && mem->backup != NULL) {
            FILE *fp = fopen(mem->backup_path, "wb");
            if (fp != NULL) {
                fwrite(mem->backup, mem->backup_size, 1, fp);
                fclose(fp);
            }
            mem->backup_dirty = false;
        }
    }
}